

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O1

bool __thiscall CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile(CodeGenWorkItem *this)

{
  FunctionBody *this_00;
  SourceDynamicProfileManager *this_01;
  code *pcVar1;
  bool bVar2;
  ExecutionFlags EVar3;
  bool bVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  SourceContextInfo *pSVar9;
  undefined4 *puVar10;
  
  this_00 = this->functionBody;
  uVar5 = Js::FunctionBody::GetCountField(this_00,ByteCodeInLoopCount);
  uVar6 = Js::FunctionBody::GetCountField(this_00,ByteCodeCount);
  uVar7 = Js::FunctionBody::GetCountField(this_00,ByteCodeCount);
  uVar8 = Js::FunctionBody::GetCountField(this_00,ByteCodeInLoopCount);
  if (((uVar5 * 100) / (uVar6 + 1) < 0x32) && (299 < uVar7 - uVar8)) {
    return false;
  }
  pSVar9 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)this_00);
  this_01 = (pSVar9->sourceDynamicProfileManager).ptr;
  if (this_01 != (SourceDynamicProfileManager *)0x0) {
    Js::FunctionBody::SetIsSpeculativeJitCandidate(this_00);
    if ((this_00->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0) {
      bVar2 = false;
      bVar4 = false;
      goto LAB_00406f4c;
    }
    if ((this_00->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar10 = 0;
    }
    EVar3 = Js::SourceDynamicProfileManager::IsFunctionExecuted
                      (this_01,((this_00->super_ParseableFunctionInfo).super_FunctionProxy.
                                functionInfo.ptr)->functionId);
    if (EVar3 == ExecutionFlags_Executed) {
      bVar4 = true;
      bVar2 = false;
      goto LAB_00406f4c;
    }
  }
  bVar2 = true;
  bVar4 = true;
LAB_00406f4c:
  if (bVar2) {
    return false;
  }
  return bVar4;
}

Assistant:

bool CodeGenWorkItem::ShouldSpeculativelyJitBasedOnProfile() const
{
    Js::FunctionBody* functionBody = this->GetFunctionBody();

    uint loopPercentage = (functionBody->GetByteCodeInLoopCount()*100) / (functionBody->GetByteCodeCount() + 1);
    uint straightLineSize = functionBody->GetByteCodeCount() - functionBody->GetByteCodeInLoopCount();

    // This ensures only small and loopy functions are prejitted.
    if(loopPercentage >= 50 || straightLineSize < 300)
    {
        Js::SourceDynamicProfileManager* profileManager = functionBody->GetSourceContextInfo()->sourceDynamicProfileManager;
        if(profileManager != nullptr)
        {
            functionBody->SetIsSpeculativeJitCandidate();

            if(!functionBody->HasDynamicProfileInfo())
            {
                return false;
            }

            Js::ExecutionFlags executionFlags = profileManager->IsFunctionExecuted(functionBody->GetLocalFunctionId());
            if(executionFlags == Js::ExecutionFlags_Executed)
            {
                return true;
            }
        }
    }
    return false;
}